

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_keyx.c
# Opt level: O0

int VKO_compute_key(uchar *shared_key,EC_POINT *pub_key,EC_KEY *priv_key,uchar *ukm,size_t ukm_size,
                   int vko_dgst_nid)

{
  int iVar1;
  int num;
  int iVar2;
  BN_CTX *ctx_00;
  char *name;
  EVP_MD *type;
  EC_GROUP *group;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  long lVar6;
  BIGNUM *b;
  BIGNUM *m;
  undefined8 in_RCX;
  EC_KEY *in_RDX;
  uchar *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  int ret;
  int half_len;
  int buf_len;
  EVP_MD *md;
  EVP_MD_CTX *mdctx;
  BN_CTX *ctx;
  EC_POINT *pnt;
  EC_GROUP *grp;
  BIGNUM *Y;
  BIGNUM *X;
  BIGNUM *scalar;
  uchar *databuf;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  BIGNUM *a;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  EVP_MD_CTX *local_78;
  EC_POINT *local_68;
  void *local_40;
  int local_4;
  
  local_40 = (void *)0x0;
  local_68 = (EC_POINT *)0x0;
  local_78 = (EVP_MD_CTX *)0x0;
  local_4 = 0;
  ctx_00 = (BN_CTX *)BN_CTX_secure_new();
  if (ctx_00 == (BN_CTX *)0x0) {
    ERR_GOST_error(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0);
    local_4 = 0;
  }
  else {
    BN_CTX_start(ctx_00);
    name = OBJ_nid2sn(in_R9D);
    type = EVP_get_digestbyname(name);
    if (type == (EVP_MD *)0x0) {
      ERR_GOST_error(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0
                    );
    }
    else {
      group = EC_KEY_get0_group(in_RDX);
      pBVar3 = BN_CTX_get(ctx_00);
      pBVar4 = BN_CTX_get(ctx_00);
      pBVar5 = BN_CTX_get(ctx_00);
      if (((pBVar5 != (BIGNUM *)0x0) &&
          (local_68 = EC_POINT_new(group), local_68 != (EC_POINT *)0x0)) &&
         (lVar6 = BN_lebin2bn(in_RCX,in_R8D,pBVar3), lVar6 != 0)) {
        a = pBVar3;
        b = EC_KEY_get0_private_key(in_RDX);
        m = (BIGNUM *)EC_GROUP_get0_order(group);
        iVar1 = BN_mod_mul(pBVar3,a,b,m,ctx_00);
        if (iVar1 != 0) {
          iVar1 = gost_ec_point_mul((EC_GROUP *)
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                    (EC_POINT *)CONCAT44(local_4,in_stack_ffffffffffffff70),
                                    (BIGNUM *)b,(EC_POINT *)a,(BIGNUM *)pBVar3,
                                    (BN_CTX *)
                                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          if (iVar1 == 0) {
            ERR_GOST_error(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff48,0);
          }
          else {
            iVar1 = EC_POINT_get_affine_coordinates(group,local_68,pBVar4,pBVar5,ctx_00);
            if (iVar1 == 0) {
              ERR_GOST_error(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                             in_stack_ffffffffffffff48,0);
            }
            else {
              pBVar3 = (BIGNUM *)EC_GROUP_get0_field(group);
              iVar1 = BN_num_bits(pBVar3);
              iVar1 = (iVar1 + 7) / 8;
              num = iVar1 << 1;
              local_40 = CRYPTO_malloc(num,
                                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                                       ,0x5b);
              if (local_40 == (void *)0x0) {
                ERR_GOST_error(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                               in_stack_ffffffffffffff48,0);
              }
              else {
                iVar2 = BN_bn2lebinpad(pBVar4,local_40,iVar1);
                if ((iVar2 == iVar1) &&
                   (iVar2 = BN_bn2lebinpad(pBVar5,(long)local_40 + (long)iVar1,iVar1),
                   iVar2 == iVar1)) {
                  local_78 = (EVP_MD_CTX *)EVP_MD_CTX_new();
                  if (local_78 == (EVP_MD_CTX *)0x0) {
                    ERR_GOST_error(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                                   in_stack_ffffffffffffff48,0);
                  }
                  else {
                    iVar1 = EVP_MD_CTX_reset(local_78);
                    if (((iVar1 == 0) ||
                        (iVar1 = EVP_DigestInit_ex(local_78,type,(ENGINE *)0x0), iVar1 == 0)) ||
                       ((iVar1 = EVP_DigestUpdate(local_78,local_40,(long)num), iVar1 == 0 ||
                        (iVar1 = EVP_DigestFinal_ex(local_78,in_RDI,(uint *)0x0), iVar1 == 0)))) {
                      ERR_GOST_error(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                                     in_stack_ffffffffffffff48,0);
                    }
                    else {
                      iVar1 = EVP_MD_get_size(type);
                      if (iVar1 < 1) {
                        local_4 = 0;
                      }
                      else {
                        local_4 = EVP_MD_get_size(type);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    BN_CTX_end(ctx_00);
    BN_CTX_free(ctx_00);
    EC_POINT_free(local_68);
    EVP_MD_CTX_free(local_78);
    CRYPTO_free(local_40);
  }
  return local_4;
}

Assistant:

int VKO_compute_key(unsigned char *shared_key,
                    const EC_POINT *pub_key, const EC_KEY *priv_key,
                    const unsigned char *ukm, const size_t ukm_size,
                    const int vko_dgst_nid)
{
    unsigned char *databuf = NULL;
    BIGNUM *scalar = NULL, *X = NULL, *Y = NULL;
    const EC_GROUP *grp = NULL;
    EC_POINT *pnt = NULL;
    BN_CTX *ctx = NULL;
    EVP_MD_CTX *mdctx = NULL;
    const EVP_MD *md = NULL;
    int buf_len, half_len;
    int ret = 0;

    if ((ctx = BN_CTX_secure_new()) == NULL) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    BN_CTX_start(ctx);

    md = EVP_get_digestbynid(vko_dgst_nid);
    if (!md) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, GOST_R_INVALID_DIGEST_TYPE);
        goto err;
    }

    grp = EC_KEY_get0_group(priv_key);
    scalar = BN_CTX_get(ctx);
    X = BN_CTX_get(ctx);

    if ((Y = BN_CTX_get(ctx)) == NULL
        || (pnt = EC_POINT_new(grp)) == NULL
        || BN_lebin2bn(ukm, ukm_size, scalar) == NULL
        || !BN_mod_mul(scalar, scalar, EC_KEY_get0_private_key(priv_key),
                       EC_GROUP_get0_order(grp), ctx))
        goto err;

#if 0
    /*-
     * These two curves have cofactor 4; the rest have cofactor 1.
     * But currently gost_ec_point_mul takes care of the cofactor clearing,
     * hence this code is not needed.
     */
    switch (EC_GROUP_get_curve_name(grp)) {
        case NID_id_tc26_gost_3410_2012_256_paramSetA:
        case NID_id_tc26_gost_3410_2012_512_paramSetC:
            if (!BN_lshift(scalar, scalar, 2))
                goto err;
            break;
    }
#endif

    if (!gost_ec_point_mul(grp, pnt, NULL, pub_key, scalar, ctx)) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, GOST_R_ERROR_POINT_MUL);
        goto err;
    }
    if (!EC_POINT_get_affine_coordinates(grp, pnt, X, Y, ctx)) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, ERR_R_EC_LIB);
        goto err;
    }

    half_len = BN_num_bytes(EC_GROUP_get0_field(grp));
    buf_len = 2 * half_len;
    if ((databuf = OPENSSL_malloc(buf_len)) == NULL) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    /*
     * Serialize elliptic curve point same way as we do it when saving key
     */
    if (BN_bn2lebinpad(X, databuf, half_len) != half_len
        || BN_bn2lebinpad(Y, databuf + half_len, half_len) != half_len)
        goto err;

    if ((mdctx = EVP_MD_CTX_new()) == NULL) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (EVP_MD_CTX_init(mdctx) == 0
        || EVP_DigestInit_ex(mdctx, md, NULL) == 0
        || EVP_DigestUpdate(mdctx, databuf, buf_len) == 0
        || EVP_DigestFinal_ex(mdctx, shared_key, NULL) == 0) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, ERR_R_EVP_LIB);
        goto err;
    }

    ret = (EVP_MD_size(md) > 0) ? EVP_MD_size(md) : 0;

 err:
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    EC_POINT_free(pnt);
    EVP_MD_CTX_free(mdctx);
    OPENSSL_free(databuf);

    return ret;
}